

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

void __thiscall
duckdb::BaseStringStatsUnifier::UnifyMinMax
          (BaseStringStatsUnifier *this,string *new_min,string *new_max)

{
  char (*pacVar1) [4];
  bool bVar2;
  anon_union_16_2_67f50693_for_value local_38;
  anon_union_16_2_67f50693_for_value local_28;
  
  if ((this->super_ColumnStatsUnifier).min_is_set == false) {
    ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_min);
    (this->super_ColumnStatsUnifier).min_is_set = true;
  }
  else {
    pacVar1 = (char (*) [4])(new_min->_M_dataplus)._M_p;
    local_28.pointer.length = (uint32_t)new_min->_M_string_length;
    if (local_28.pointer.length < 0xd) {
      local_28._12_4_ = 0;
      local_28.pointer.prefix[0] = '\0';
      local_28.pointer.prefix[1] = '\0';
      local_28.pointer.prefix[2] = '\0';
      local_28.pointer.prefix[3] = '\0';
      local_28._8_4_ = 0;
      if (local_28.pointer.length != 0) {
        switchD_00b1422a::default
                  (local_28.pointer.prefix,pacVar1,(ulong)(local_28.pointer.length & 0xf));
      }
    }
    else {
      local_28.pointer.prefix = *pacVar1;
      local_28._8_4_ = SUB84(pacVar1,0);
      local_28._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
    }
    pacVar1 = (char (*) [4])(this->super_ColumnStatsUnifier).global_min._M_dataplus._M_p;
    local_38.pointer.length = (uint32_t)(this->super_ColumnStatsUnifier).global_min._M_string_length
    ;
    if (local_38.pointer.length < 0xd) {
      local_38._12_4_ = 0;
      local_38.pointer.prefix[0] = '\0';
      local_38.pointer.prefix[1] = '\0';
      local_38.pointer.prefix[2] = '\0';
      local_38.pointer.prefix[3] = '\0';
      local_38._8_4_ = 0;
      if (local_38.pointer.length != 0) {
        switchD_00b1422a::default
                  (local_38.pointer.prefix,pacVar1,(ulong)(local_38.pointer.length & 0xf));
      }
    }
    else {
      local_38.pointer.prefix = *pacVar1;
      local_38._8_4_ = SUB84(pacVar1,0);
      local_38._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
    }
    bVar2 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_38.pointer,(string_t *)&local_28.pointer);
    if (bVar2) {
      ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_min);
    }
  }
  if ((this->super_ColumnStatsUnifier).max_is_set == false) {
    ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_max);
    (this->super_ColumnStatsUnifier).max_is_set = true;
  }
  else {
    pacVar1 = (char (*) [4])(new_max->_M_dataplus)._M_p;
    local_28.pointer.length = (uint32_t)new_max->_M_string_length;
    if (local_28.pointer.length < 0xd) {
      local_28._12_4_ = 0;
      local_28.pointer.prefix[0] = '\0';
      local_28.pointer.prefix[1] = '\0';
      local_28.pointer.prefix[2] = '\0';
      local_28.pointer.prefix[3] = '\0';
      local_28._8_4_ = 0;
      if (local_28.pointer.length != 0) {
        switchD_00b1422a::default
                  (local_28.pointer.prefix,pacVar1,(ulong)(local_28.pointer.length & 0xf));
      }
    }
    else {
      local_28.pointer.prefix = *pacVar1;
      local_28._8_4_ = SUB84(pacVar1,0);
      local_28._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
    }
    pacVar1 = (char (*) [4])(this->super_ColumnStatsUnifier).global_max._M_dataplus._M_p;
    local_38.pointer.length = (uint32_t)(this->super_ColumnStatsUnifier).global_max._M_string_length
    ;
    if (local_38.pointer.length < 0xd) {
      local_38._12_4_ = 0;
      local_38.pointer.prefix[0] = '\0';
      local_38.pointer.prefix[1] = '\0';
      local_38.pointer.prefix[2] = '\0';
      local_38.pointer.prefix[3] = '\0';
      local_38._8_4_ = 0;
      if (local_38.pointer.length != 0) {
        switchD_00b1422a::default
                  (local_38.pointer.prefix,pacVar1,(ulong)(local_38.pointer.length & 0xf));
      }
    }
    else {
      local_38.pointer.prefix = *pacVar1;
      local_38._8_4_ = SUB84(pacVar1,0);
      local_38._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
    }
    bVar2 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_28.pointer,(string_t *)&local_38.pointer);
    if (bVar2) {
      ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_max);
    }
  }
  return;
}

Assistant:

void UnifyMinMax(const string &new_min, const string &new_max) override {
		if (!min_is_set) {
			global_min = new_min;
			min_is_set = true;
		} else {
			if (LessThan::Operation(string_t(new_min), string_t(global_min))) {
				global_min = new_min;
			}
		}
		if (!max_is_set) {
			global_max = new_max;
			max_is_set = true;
		} else {
			if (GreaterThan::Operation(string_t(new_max), string_t(global_max))) {
				global_max = new_max;
			}
		}
	}